

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

int __thiscall QComboBoxPrivateContainer::topMargin(QComboBoxPrivateContainer *this)

{
  bool bVar1;
  QListView *pQVar2;
  QTableView *this_00;
  QTableView *tview;
  QListView *lview;
  QListView *in_stack_ffffffffffffffe0;
  uint local_4;
  
  pQVar2 = qobject_cast<QListView_const*>((QObject *)0x53438f);
  if (pQVar2 == (QListView *)0x0) {
    this_00 = qobject_cast<QTableView_const*>((QObject *)0x5343b9);
    if (this_00 == (QTableView *)0x0) {
      local_4 = 0;
    }
    else {
      bVar1 = QTableView::showGrid(this_00);
      local_4 = (uint)bVar1;
    }
  }
  else {
    local_4 = QListView::spacing(in_stack_ffffffffffffffe0);
  }
  return local_4;
}

Assistant:

int QComboBoxPrivateContainer::topMargin() const
{
    if (const QListView *lview = qobject_cast<const QListView*>(view))
        return lview->spacing();
#if QT_CONFIG(tableview)
    if (const QTableView *tview = qobject_cast<const QTableView*>(view))
        return tview->showGrid() ? 1 : 0;
#endif
    return 0;
}